

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testNumberOfNeighborsWithInvalidSet(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *this;
  Int64Parameter *this_00;
  Int64Set *pIVar2;
  NearestNeighborsIndex *this_01;
  SingleKdTreeIndex *pSVar3;
  ostream *poVar4;
  ostream *this_02;
  int iVar5;
  char *pcVar6;
  undefined1 auStack_98 [40];
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  this = CoreML::Specification::Model::mutable_knearestneighborsclassifier(&m1);
  this_00 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,0);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,4);
  this_00->defaultvalue_ = 4;
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(this);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(this);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this_01);
  pSVar3 = CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this_01);
  pSVar3->leafsize_ = 0x1e;
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel(this,"Default");
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    this_02 = (ostream *)std::operator<<(poVar4,":");
    iVar5 = 0x274;
LAB_0013e02a:
    poVar4 = (ostream *)std::ostream::operator<<(this_02,iVar5);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "!((res).good())";
  }
  else {
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    (pIVar2->values_).current_size_ = 0;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,-1);
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,4);
    this_00->defaultvalue_ = 4;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar5 = 0x27d;
      goto LAB_0013e02a;
    }
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    (pIVar2->values_).current_size_ = 0;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,-1);
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,4);
    this_00->defaultvalue_ = -1;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar5 = 0x286;
      goto LAB_0013e02a;
    }
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    (pIVar2->values_).current_size_ = 0;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,1);
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,4);
    this_00->defaultvalue_ = 4;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    iVar5 = 0;
    if (bVar1) goto LAB_0013e06a;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x28f);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "(res).good()";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 1;
LAB_0013e06a:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar5;
}

Assistant:

int testNumberOfNeighborsWithInvalidSet() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_set()->add_values(0);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(4);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since defaultValue is not in set
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_set()->clear_values();
    numberOfNeighbors->mutable_set()->add_values(-1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(4);

    // Validation should fail since set values should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_set()->clear_values();
    numberOfNeighbors->mutable_set()->add_values(-1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(-1);

    // Validation should fail since set values should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_set()->clear_values();
    numberOfNeighbors->mutable_set()->add_values(1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(4);

    // Validation should now succeed
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}